

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::
description_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_90,&local_b0,"winding mode ");
  pcVar1 = (char *)0x0;
  if (*this == 1) {
    pcVar1 = "cw";
  }
  __rhs = "ccw";
  if (*this != 0) {
    __rhs = pcVar1;
  }
  std::operator+(&local_70,&local_90,__rhs);
  std::operator+(&local_50,&local_70,", ");
  pcVar1 = "don\'t ";
  if (*(char *)((long)this + 4) != '\0') {
    pcVar1 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+(&local_30,&local_50,pcVar1);
  std::operator+(__return_storage_ptr__,&local_30,"use point mode");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

string	description		(void) const { return string() + "winding mode " + getWindingShaderName(winding) + ", " + (usePointMode ? "" : "don't ") + "use point mode"; }